

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Cube::setupFrontFace(Cube *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar3 = this->x;
  fVar4 = this->y;
  fVar5 = this->h + fVar4;
  uVar1 = this->l;
  uVar2 = this->b;
  fVar6 = fVar3 + (float)uVar1;
  fVar7 = this->z + (float)uVar2;
  this->positionData[0] = fVar3;
  this->positionData[1] = fVar4;
  this->positionData[2] = fVar7;
  this->positionData[3] = fVar6;
  this->positionData[4] = fVar4;
  this->positionData[5] = fVar7;
  this->positionData[6] = fVar6;
  this->positionData[7] = fVar5;
  this->positionData[8] = fVar7;
  this->positionData[9] = fVar6;
  this->positionData[10] = fVar5;
  this->positionData[0xb] = fVar7;
  this->positionData[0xc] = fVar3;
  this->positionData[0xd] = fVar4;
  this->positionData[0xe] = fVar7;
  this->positionData[0xf] = fVar3;
  this->positionData[0x10] = fVar5;
  this->positionData[0x11] = fVar7;
  return;
}

Assistant:

void setupFrontFace() {
        float frontFace[]={
            x,y,z+b,
            x+l,y,z+b,
            x+l,y+h,z+b,
            x+l,y+h,z+b,
            x,y,z+b,
            x,y+h,z+b

        };

        arrayCopy(frontFace,positionData,0);
    }